

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiID tab_id,ImGuiTabBarSection *sections)

{
  int iVar1;
  ImGuiTabItem *pIVar2;
  int *in_RDX;
  int *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float tab_x2;
  float tab_x1;
  float scrollable_width;
  int order;
  float margin;
  ImGuiContext *g;
  ImGuiTabItem *tab;
  ImGuiTabBar *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float local_44;
  
  pIVar2 = TabBarFindTabByID(in_stack_ffffffffffffffa8,0);
  if ((pIVar2 != (ImGuiTabItem *)0x0) && ((pIVar2->Flags & 0xc0U) == 0)) {
    fVar3 = GImGui->FontSize * 1.0;
    iVar1 = TabBarGetTabOrder((ImGuiTabBar *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (ImGuiTabItem *)in_stack_ffffffffffffffa8);
    fVar4 = TabBarCalcScrollableWidth
                      ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (ImGuiTabBarSection *)in_stack_ffffffffffffffa8);
    if (*in_RDX + -1 < iVar1) {
      local_44 = -fVar3;
    }
    else {
      local_44 = 0.0;
    }
    local_44 = (pIVar2->Offset - (float)in_RDX[1]) + local_44;
    if (*in_RDI - in_RDX[6] <= iVar1 + 1) {
      fVar3 = 1.0;
    }
    fVar3 = (pIVar2->Offset - (float)in_RDX[1]) + pIVar2->Width + fVar3;
    in_RDI[0x15] = 0;
    if ((local_44 < (float)in_RDI[0x14]) || (fVar4 <= fVar3 - local_44)) {
      fVar4 = ImMax<float>((float)in_RDI[0x13] - fVar3,0.0);
      in_RDI[0x15] = (int)fVar4;
      in_RDI[0x14] = (int)local_44;
    }
    else if ((float)in_RDI[0x14] < fVar3 - fVar4) {
      fVar5 = ImMax<float>((local_44 - fVar4) - (float)in_RDI[0x13],0.0);
      in_RDI[0x15] = (int)fVar5;
      in_RDI[0x14] = (int)(fVar3 - fVar4);
    }
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiID tab_id, ImGuiTabBarSection* sections)
{
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id);
    if (tab == NULL)
        return;
    if (tab->Flags & ImGuiTabItemFlags_SectionMask_)
        return;

    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = TabBarGetTabOrder(tab_bar, tab);

    // Scrolling happens only in the central section (leading/trailing sections are not scrolling)
    float scrollable_width = TabBarCalcScrollableWidth(tab_bar, sections);

    // We make all tabs positions all relative Sections[0].Width to make code simpler
    float tab_x1 = tab->Offset - sections[0].Width + (order > sections[0].TabCount - 1 ? -margin : 0.0f);
    float tab_x2 = tab->Offset - sections[0].Width + tab->Width + (order + 1 < tab_bar->Tabs.Size - sections[2].TabCount ? margin : 1.0f);
    tab_bar->ScrollingTargetDistToVisibility = 0.0f;
    if (tab_bar->ScrollingTarget > tab_x1 || (tab_x2 - tab_x1 >= scrollable_width))
    {
        // Scroll to the left
        tab_bar->ScrollingTargetDistToVisibility = ImMax(tab_bar->ScrollingAnim - tab_x2, 0.0f);
        tab_bar->ScrollingTarget = tab_x1;
    }
    else if (tab_bar->ScrollingTarget < tab_x2 - scrollable_width)
    {
        // Scroll to the right
        tab_bar->ScrollingTargetDistToVisibility = ImMax((tab_x1 - scrollable_width) - tab_bar->ScrollingAnim, 0.0f);
        tab_bar->ScrollingTarget = tab_x2 - scrollable_width;
    }
}